

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

WeakArenaReference<Js::IDiagObjectModelWalkerBase> * __thiscall
Js::RecyclableMethodsGroupDisplay::CreateWalker(RecyclableMethodsGroupDisplay *this)

{
  ThreadContext *this_00;
  DebugManager *this_01;
  HeapAllocator *alloc;
  WeakArenaReference<Js::IDiagObjectModelWalkerBase> *this_02;
  TrackAllocData local_48;
  ReferencedArenaAdapter *local_20;
  ReferencedArenaAdapter *pRefArena;
  RecyclableMethodsGroupDisplay *this_local;
  
  if (this->methodGroupWalker != (RecyclableMethodsGroupWalker *)0x0) {
    pRefArena = (ReferencedArenaAdapter *)this;
    this_00 = ScriptContext::GetThreadContext((this->super_RecyclableObjectDisplay).scriptContext);
    this_01 = ThreadContext::GetDebugManager(this_00);
    local_20 = DebugManager::GetDiagnosticArena(this_01);
    if (local_20 != (ReferencedArenaAdapter *)0x0) {
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_48,
                 (type_info *)&Memory::WeakArenaReference<Js::IDiagObjectModelWalkerBase>::typeinfo,
                 0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                 ,0xf85);
      alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_48);
      this_02 = (WeakArenaReference<Js::IDiagObjectModelWalkerBase> *)
                new<Memory::HeapAllocator>(0x10,alloc,0x350bd0);
      Memory::WeakArenaReference<Js::IDiagObjectModelWalkerBase>::WeakArenaReference
                (this_02,local_20,(IDiagObjectModelWalkerBase *)this->methodGroupWalker);
      return this_02;
    }
  }
  return (WeakArenaReference<Js::IDiagObjectModelWalkerBase> *)0x0;
}

Assistant:

WeakArenaReference<IDiagObjectModelWalkerBase>* RecyclableMethodsGroupDisplay::CreateWalker()
    {
        if (methodGroupWalker)
        {
            ReferencedArenaAdapter* pRefArena = scriptContext->GetThreadContext()->GetDebugManager()->GetDiagnosticArena();
            if (pRefArena)
            {
                return HeapNew(WeakArenaReference<IDiagObjectModelWalkerBase>, pRefArena, methodGroupWalker);
            }
        }
        return nullptr;
    }